

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O3

void __thiscall
DifferentialEquation::DifferentialEquation
          (DifferentialEquation *this,Time *time,double x0,double dx0,string *name,string *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_48;
  double local_28;
  double local_20;
  
  local_28 = x0;
  local_20 = dx0;
  StochasticProcess::StochasticProcess((StochasticProcess *)this,time,name,type);
  (this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__DifferentialEquation_0015baa8;
  (this->super_StochasticVariable).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__DifferentialEquation_0015bb38;
  (this->super_StochasticVariable).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__DifferentialEquation_0015bb80;
  this->eqnX0 = local_28;
  this->eqnTermAmount = 0;
  (this->eqnIntegrands).
  super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eqnIntegrands).
  super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eqnIntegrands).
  super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eqnIntegrators).
  super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eqnIntegrators).
  super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eqnIntegrators).
  super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->eqnMethodPtr = (offset_in_DifferentialEquation_to_subr)stepEulerIto;
  *(undefined8 *)&this->field_0x158 = 0;
  (this->super_StochasticVariable).super_StochasticProcess.stochNextValue = local_28;
  (this->super_StochasticVariable).super_StochasticProcess.stochCurrentValue = local_28;
  this->eqnIncrement = local_20;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"equation","");
  Parametric::addParameter((Parametric *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"mode","");
  Parametric::addParameter((Parametric *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"starting-value","");
  Parametric::addParameter((Parametric *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

DifferentialEquation::DifferentialEquation(Time *time, double x0, double dx0, const string& name, const string& type)
	: StochasticVariable(time, name, type)
{
	eqnX0 = x0;
	eqnTermAmount = 0;
	eqnIntegrands = vector<StochasticFunction *>();
	eqnTermAmount = 0;
	eqnIntegrators = vector<StochasticVariable *>();
	eqnMethodPtr = &DifferentialEquation::stepEulerIto;
	stochCurrentValue = stochNextValue = x0;
	eqnIncrement = dx0;
	addParameter("equation");
	addParameter("mode");
	addParameter("starting-value");
}